

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

void print_ir(FILE *io,uint depth,void *_ir)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  
LAB_001495cd:
  if ((int *)_ir == (int *)0x0) {
    return;
  }
  pcVar7 = *(char **)((long)_ir + 8);
  pcVar3 = strrchr(pcVar7,0x2f);
  uVar1 = depth;
  if (pcVar3 == (char *)0x0) {
    pcVar4 = strrchr(pcVar7,0x5c);
    pcVar3 = pcVar4 + 1;
    if (pcVar4 == (char *)0x0) {
      pcVar3 = pcVar7;
    }
  }
  else {
    pcVar3 = pcVar3 + 1;
  }
  for (; uVar1 != 0; uVar1 = uVar1 - 1) {
    fwrite("  ",2,1,(FILE *)io);
  }
  fprintf((FILE *)io,"[ %s:%d ",pcVar3,(ulong)*(uint *)((long)_ir + 0x10));
  if (0x15 < *_ir - 1U) {
switchD_00149663_caseD_b:
    __assert_fail("0 && \"unexpected IR node\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x16bf,"void print_ir(FILE *, unsigned int, void *)");
  }
  depth = depth + 1;
  switch(*_ir) {
  case 1:
    fwrite("CONSTANT ",9,1,(FILE *)io);
    if (*(int *)((long)_ir + 0x18) - 4U < 5) {
      iVar2 = *(int *)((long)_ir + 0x1c);
      lVar8 = 0;
      if (1 < iVar2) {
        do {
          fprintf((FILE *)io,"%ff, ",(double)*(float *)((long)_ir + (lVar8 + 8) * 4));
          lVar8 = lVar8 + 1;
          iVar2 = *(int *)((long)_ir + 0x1c);
        } while (lVar8 < (long)iVar2 + -1);
      }
      if (0 < iVar2) {
        fprintf((FILE *)io,"%ff",(double)*(float *)((long)_ir + (lVar8 + 8) * 4));
      }
    }
    else {
      if (2 < *(int *)((long)_ir + 0x18) - 1U) {
        __assert_fail("0 && \"shouldn\'t happen\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1643,"void print_ir(FILE *, unsigned int, void *)");
      }
      iVar2 = *(int *)((long)_ir + 0x1c);
      if (iVar2 < 2) {
        lVar8 = 0;
      }
      else {
        lVar8 = 0;
        do {
          fprintf((FILE *)io,"%d, ",(ulong)*(uint *)((long)_ir + (lVar8 + 8) * 4));
          lVar8 = lVar8 + 1;
          iVar2 = *(int *)((long)_ir + 0x1c);
        } while (lVar8 < (long)iVar2 + -1);
      }
      if (0 < iVar2) {
        fprintf((FILE *)io,"%d",(ulong)*(uint *)((long)_ir + (lVar8 + 8) * 4));
      }
    }
    pcVar7 = " ]\n";
    sVar6 = 3;
LAB_00149b71:
    fwrite(pcVar7,sVar6,1,(FILE *)io);
    return;
  case 2:
    uVar5 = (ulong)*(uint *)((long)_ir + 0x20);
    pcVar7 = "TEMP %d ]\n";
    goto LAB_00149aee;
  case 3:
    fwrite("BINOP ",6,1,(FILE *)io);
    switch(*(int *)((long)_ir + 0x20)) {
    case 0:
      sVar6 = 3;
      pcVar7 = "ADD";
      break;
    case 1:
      sVar6 = 8;
      pcVar7 = "SUBTRACT";
      break;
    case 2:
      sVar6 = 8;
      pcVar7 = "MULTIPLY";
      break;
    case 3:
      sVar6 = 6;
      pcVar7 = "DIVIDE";
      break;
    case 4:
      sVar6 = 6;
      pcVar7 = "MODULO";
      break;
    case 5:
      sVar6 = 3;
      pcVar7 = "AND";
      break;
    case 6:
      sVar6 = 2;
      pcVar7 = "OR";
      break;
    case 7:
      sVar6 = 3;
      pcVar7 = "XOR";
      break;
    case 8:
      sVar6 = 6;
      pcVar7 = "LSHIFT";
      break;
    case 9:
      sVar6 = 6;
      pcVar7 = "RSHIFT";
      break;
    case 10:
      sVar6 = 7;
      pcVar7 = "UNKNOWN";
      break;
    default:
      __assert_fail("0 && \"unexpected case\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1674,"void print_ir(FILE *, unsigned int, void *)");
    }
    fwrite(pcVar7,sVar6,1,(FILE *)io);
    fwrite(" ]\n",3,1,(FILE *)io);
    print_ir(io,depth,*(void **)((long)_ir + 0x28));
    _ir = *(void **)((long)_ir + 0x30);
    goto LAB_001495cd;
  case 4:
    uVar5 = (ulong)*(uint *)((long)_ir + 0x20);
    pcVar7 = "MEMORY %d ]\n";
    goto LAB_00149aee;
  case 5:
    fprintf((FILE *)io,"CALL %d ]\n",(ulong)*(uint *)((long)_ir + 0x20));
    _ir = *(void **)((long)_ir + 0x28);
    goto LAB_001495cd;
  case 6:
    sVar6 = 7;
    pcVar7 = "ESEQ ]\n";
    break;
  case 7:
    fwrite("ARRAY ]\n",8,1,(FILE *)io);
    goto LAB_001498fa;
  case 8:
    sVar6 = 10;
    pcVar7 = "CONVERT ]\n";
    break;
  case 9:
    fwrite("SWIZZLE",7,1,(FILE *)io);
    if (1 < *(int *)((long)_ir + 0x1c)) {
      lVar8 = 0;
      do {
        fprintf((FILE *)io," %d",(ulong)(uint)(int)*(char *)((long)_ir + lVar8 + 0x28));
        lVar8 = lVar8 + 1;
      } while (lVar8 < (long)*(int *)((long)_ir + 0x1c) + -1);
    }
    sVar6 = 3;
    pcVar7 = " ]\n";
    break;
  case 10:
    sVar6 = 0xc;
    pcVar7 = "CONSTRUCT ]\n";
    break;
  default:
    goto switchD_00149663_caseD_b;
  case 0xd:
    sVar6 = 7;
    pcVar7 = "MOVE ]\n";
    goto LAB_0014984a;
  case 0xe:
    goto switchD_00149663_caseD_e;
  case 0xf:
    uVar5 = (ulong)*(uint *)((long)_ir + 0x18);
    pcVar7 = "JUMP %d ]\n";
    goto LAB_00149aee;
  case 0x10:
    fwrite("CJUMP ",6,1,(FILE *)io);
    switch(*(int *)((long)_ir + 0x18)) {
    case 0:
      sVar6 = 3;
      pcVar7 = "EQL";
      break;
    case 1:
      sVar6 = 3;
      pcVar7 = "NEQ";
      break;
    case 2:
      sVar6 = 2;
      pcVar7 = "LT";
      break;
    case 3:
      sVar6 = 2;
      pcVar7 = "GT";
      break;
    case 4:
      sVar6 = 3;
      pcVar7 = "LEQ";
      break;
    case 5:
      sVar6 = 3;
      pcVar7 = "GEQ";
      break;
    case 6:
      sVar6 = 7;
      pcVar7 = "UNKNOWN";
      break;
    default:
      __assert_fail("0 && \"unexpected case\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x16ac,"void print_ir(FILE *, unsigned int, void *)");
    }
    fwrite(pcVar7,sVar6,1,(FILE *)io);
    fprintf((FILE *)io," %d %d ]\n",(ulong)*(uint *)((long)_ir + 0x30),
            (ulong)*(uint *)((long)_ir + 0x34));
LAB_001498fa:
    print_ir(io,depth,*(void **)((long)_ir + 0x20));
    _ir = *(void **)((long)_ir + 0x28);
    goto LAB_001495cd;
  case 0x11:
    sVar6 = 6;
    pcVar7 = "SEQ ]\n";
    goto LAB_0014984a;
  case 0x12:
    uVar5 = (ulong)*(uint *)((long)_ir + 0x18);
    pcVar7 = "LABEL %d ]\n";
LAB_00149aee:
    fprintf((FILE *)io,pcVar7,uVar5);
    return;
  case 0x13:
    pcVar7 = "DISCARD ]\n";
    sVar6 = 10;
    goto LAB_00149b71;
  case 0x16:
    sVar6 = 0xb;
    pcVar7 = "EXPRLIST ]\n";
LAB_0014984a:
    fwrite(pcVar7,sVar6,1,(FILE *)io);
    print_ir(io,depth,*(void **)((long)_ir + 0x18));
    _ir = *(void **)((long)_ir + 0x20);
    goto LAB_001495cd;
  }
  fwrite(pcVar7,sVar6,1,(FILE *)io);
  _ir = *(void **)((long)_ir + 0x20);
  goto LAB_001495cd;
switchD_00149663_caseD_e:
  fwrite("EXPRSTMT ]\n",0xb,1,(FILE *)io);
  _ir = *(void **)((long)_ir + 0x18);
  goto LAB_001495cd;
}

Assistant:

static void print_ir(FILE *io, unsigned int depth, void *_ir)
{
    MOJOSHADER_irNode *ir = (MOJOSHADER_irNode *) _ir;
    if (ir == NULL)
        return;

    const char *fname = strrchr(ir->ir.filename, '/');
    if (fname != NULL)
        fname++;
    else
    {
        fname = strrchr(ir->ir.filename, '\\');
        if (fname != NULL)
            fname++;
        else
            fname = ir->ir.filename;
    } // else

    int i;
    for (i = 0; i < depth; i++)
        fprintf(io, "  ");
    depth++;

    fprintf(io, "[ %s:%d ", fname, ir->ir.line);

    switch (ir->ir.type)
    {
        case MOJOSHADER_IR_LABEL:
            fprintf(io, "LABEL %d ]\n", ir->stmt.label.index);
            break;

        case MOJOSHADER_IR_CONSTANT:
            fprintf(io, "CONSTANT ");
            switch (ir->expr.constant.info.type)
            {
                case MOJOSHADER_AST_DATATYPE_BOOL:
                case MOJOSHADER_AST_DATATYPE_INT:
                case MOJOSHADER_AST_DATATYPE_UINT:
                    for (i = 0; i < ir->expr.constant.info.elements-1; i++)
                        fprintf(io, "%d, ", ir->expr.constant.value.ival[i]);
                    if (ir->expr.constant.info.elements > 0)
                        fprintf(io, "%d", ir->expr.constant.value.ival[i]);
                    break;

                case MOJOSHADER_AST_DATATYPE_FLOAT:
                case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
                case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
                case MOJOSHADER_AST_DATATYPE_HALF:
                case MOJOSHADER_AST_DATATYPE_DOUBLE:
                    for (i = 0; i < ir->expr.constant.info.elements-1; i++)
                        fprintf(io, "%ff, ", ir->expr.constant.value.fval[i]);
                    if (ir->expr.constant.info.elements > 0)
                        fprintf(io, "%ff", ir->expr.constant.value.fval[i]);
                    break;

                default: assert(0 && "shouldn't happen");
            } // switch
            fprintf(io, " ]\n");
            break;

        case MOJOSHADER_IR_TEMP:
            fprintf(io, "TEMP %d ]\n", ir->expr.temp.index);
            break;

        case MOJOSHADER_IR_DISCARD:
            fprintf(io, "DISCARD ]\n");
            break;

        case MOJOSHADER_IR_SWIZZLE:
            fprintf(io, "SWIZZLE");
            for (i = 0; i < ir->expr.swizzle.info.elements-1; i++)
                fprintf(io, " %d", (int) ir->expr.swizzle.channels[i]);
            fprintf(io, " ]\n");
            print_ir(io, depth, ir->expr.swizzle.expr);
            break;

        case MOJOSHADER_IR_CONSTRUCT:
            fprintf(io, "CONSTRUCT ]\n");
            print_ir(io, depth, ir->expr.construct.args);
            break;

        case MOJOSHADER_IR_CONVERT:
            fprintf(io, "CONVERT ]\n");
            print_ir(io, depth, ir->expr.convert.expr);
            break;

        case MOJOSHADER_IR_BINOP:
            fprintf(io, "BINOP ");
            switch (ir->expr.binop.op)
            {
                #define PRINT_IR_BINOP(x) \
                    case MOJOSHADER_IR_BINOP_##x: fprintf(io, #x); break;
                PRINT_IR_BINOP(ADD)
                PRINT_IR_BINOP(SUBTRACT)
                PRINT_IR_BINOP(MULTIPLY)
                PRINT_IR_BINOP(DIVIDE)
                PRINT_IR_BINOP(MODULO)
                PRINT_IR_BINOP(AND)
                PRINT_IR_BINOP(OR)
                PRINT_IR_BINOP(XOR)
                PRINT_IR_BINOP(LSHIFT)
                PRINT_IR_BINOP(RSHIFT)
                PRINT_IR_BINOP(UNKNOWN)
                #undef PRINT_IR_BINOP
                default: assert(0 && "unexpected case"); break;
            } // switch
            fprintf(io, " ]\n");
            print_ir(io, depth, ir->expr.binop.left);
            print_ir(io, depth, ir->expr.binop.right);
            break;

        case MOJOSHADER_IR_MEMORY:
            fprintf(io, "MEMORY %d ]\n", ir->expr.memory.index);
            break;

        case MOJOSHADER_IR_CALL:
            fprintf(io, "CALL %d ]\n", ir->expr.call.index);
            print_ir(io, depth, ir->expr.call.args);
            break;

        case MOJOSHADER_IR_ESEQ:
            fprintf(io, "ESEQ ]\n");
            print_ir(io, depth, ir->expr.eseq.stmt);
            break;

        case MOJOSHADER_IR_ARRAY:
            fprintf(io, "ARRAY ]\n");
            print_ir(io, depth, ir->expr.array.array);
            print_ir(io, depth, ir->expr.array.element);
            break;

        case MOJOSHADER_IR_MOVE:
            fprintf(io, "MOVE ]\n");
            print_ir(io, depth, ir->stmt.move.dst);
            print_ir(io, depth, ir->stmt.move.src);
            break;

        case MOJOSHADER_IR_EXPR_STMT:
            fprintf(io, "EXPRSTMT ]\n");
            print_ir(io, depth, ir->stmt.expr.expr);
            break;

        case MOJOSHADER_IR_JUMP:
            fprintf(io, "JUMP %d ]\n", ir->stmt.jump.label);
            break;

        case MOJOSHADER_IR_CJUMP:
            fprintf(io, "CJUMP ");
            switch (ir->stmt.cjump.cond)
            {
                #define PRINT_IR_COND(x) \
                    case MOJOSHADER_IR_COND_##x: fprintf(io, #x); break;
                PRINT_IR_COND(EQL)
                PRINT_IR_COND(NEQ)
                PRINT_IR_COND(LT)
                PRINT_IR_COND(GT)
                PRINT_IR_COND(LEQ)
                PRINT_IR_COND(GEQ)
                PRINT_IR_COND(UNKNOWN)
                #undef PRINT_IR_COND
                default: assert(0 && "unexpected case"); break;
            } // switch
            fprintf(io, " %d %d ]\n", ir->stmt.cjump.iftrue, ir->stmt.cjump.iffalse);
            print_ir(io, depth, ir->stmt.cjump.left);
            print_ir(io, depth, ir->stmt.cjump.right);
            break;

        case MOJOSHADER_IR_SEQ:
            fprintf(io, "SEQ ]\n");
            print_ir(io, depth, ir->stmt.seq.first);
            print_ir(io, depth, ir->stmt.seq.next);  // !!! FIXME: don't recurse?
            break;

        case MOJOSHADER_IR_EXPRLIST:
            fprintf(io, "EXPRLIST ]\n");
            print_ir(io, depth, ir->misc.exprlist.expr);
            print_ir(io, depth, ir->misc.exprlist.next);  // !!! FIXME: don't recurse?
            break;

        default: assert(0 && "unexpected IR node"); break;
    } // switch
}